

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

wstring * __thiscall
mjs::parser::get_identifier_name_abi_cxx11_
          (wstring *__return_storage_ptr__,parser *this,char *func,int line)

{
  bool bVar1;
  wstring *pwVar2;
  ostream *poVar3;
  token *t_00;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  token_type t_01;
  string local_228 [32];
  ostringstream local_208 [8];
  ostringstream oss;
  token local_90;
  token_type local_64;
  int local_60;
  token_type t;
  undefined1 local_50 [8];
  token id;
  int line_local;
  char *func_local;
  parser *this_local;
  
  id.field_1._28_4_ = line;
  accept((parser *)local_50,(int)this,(sockaddr *)0x2,
         (socklen_t *)CONCAT44(in_register_0000000c,line));
  bVar1 = token::operator_cast_to_bool((token *)local_50);
  if (bVar1) {
    pwVar2 = token::text_abi_cxx11_((token *)local_50);
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)pwVar2);
    local_60 = 1;
  }
  else if (((int)this->version_ < 2) ||
          (local_64 = current_token_type(this), 0x3c < local_64 - abstract_)) {
    local_60 = 0;
  }
  else {
    get_token(&local_90,this);
    token::~token(&local_90);
    token_string_abi_cxx11_(__return_storage_ptr__,(mjs *)(ulong)local_64,t_01);
    local_60 = 1;
  }
  token::~token((token *)local_50);
  if (local_60 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_208);
    poVar3 = std::operator<<((ostream *)local_208,"Expected identifier name in ");
    poVar3 = std::operator<<(poVar3,func);
    poVar3 = std::operator<<(poVar3," line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,id.field_1._28_4_);
    poVar3 = std::operator<<(poVar3," got ");
    t_00 = current_token(this);
    mjs::operator<<(poVar3,t_00);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_228);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring parser::get_identifier_name(const char* func, int line) {
    if (auto id = accept(token_type::identifier)) {
        return id.text();
    } else if (version_ >= version::es5) {
        // In ES5+ IdentifierName is used in various grammars
        // This means reserved words can be used as identifiers in certain contexts (e.g. Left-Hand-Side and Object Initialiser Expressions)
        switch (const auto t = current_token_type()) {
#define CASE_KEYWORD(tt, ...) case token_type::tt##_:
            MJS_KEYWORDS(CASE_KEYWORD);
#undef CASE_KEYWORD
            {
                get_token(); // Advance to next token
                return token_string(t);
            }
        default:
            break;
        }
    }

    std::ostringstream oss;
    oss << "Expected identifier name in " << func << " line " << line << " got " << current_token();
    throw std::runtime_error(oss.str());
}